

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MapFieldGenerator::GenerateByteSize
          (MapFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Printer *printer_local;
  MapFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "total_size += $tag_size$ *\n    ::google::protobuf::internal::FromIntSize(this->$name$_size());\n{\n  ::google::protobuf::scoped_ptr<$map_classname$> entry;\n  for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n      it = this->$name$().begin();\n      it != this->$name$().end(); ++it) {\n"
                    );
  bVar1 = SupportsArenas(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "    if (entry.get() != NULL && entry->GetArena() != NULL) {\n      entry.release();\n    }\n"
                      );
  }
  io::Printer::Print(printer,&this->variables_,
                     "    entry.reset($name$_.New$wrapper$(it->first, it->second));\n    total_size += ::google::protobuf::internal::WireFormatLite::\n        $declared_type$SizeNoVirtual(*entry);\n  }\n"
                    );
  bVar1 = SupportsArenas(this->descriptor_);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "  if (entry.get() != NULL && entry->GetArena() != NULL) {\n    entry.release();\n  }\n"
                      );
  }
  io::Printer::Print(printer,"}\n");
  return;
}

Assistant:

void MapFieldGenerator::
GenerateByteSize(io::Printer* printer) const {
  printer->Print(variables_,
      "total_size += $tag_size$ *\n"
      "    ::google::protobuf::internal::FromIntSize(this->$name$_size());\n"
      "{\n"
      "  ::google::protobuf::scoped_ptr<$map_classname$> entry;\n"
      "  for (::google::protobuf::Map< $key_cpp$, $val_cpp$ >::const_iterator\n"
      "      it = this->$name$().begin();\n"
      "      it != this->$name$().end(); ++it) {\n");

  // If entry is allocated by arena, its desctructor should be avoided.
  if (SupportsArenas(descriptor_)) {
    printer->Print(variables_,
        "    if (entry.get() != NULL && entry->GetArena() != NULL) {\n"
        "      entry.release();\n"
        "    }\n");
  }

  printer->Print(variables_,
      "    entry.reset($name$_.New$wrapper$(it->first, it->second));\n"
      "    total_size += ::google::protobuf::internal::WireFormatLite::\n"
      "        $declared_type$SizeNoVirtual(*entry);\n"
      "  }\n");

  // If entry is allocated by arena, its desctructor should be avoided.
  if (SupportsArenas(descriptor_)) {
    printer->Print(variables_,
        "  if (entry.get() != NULL && entry->GetArena() != NULL) {\n"
        "    entry.release();\n"
        "  }\n");
  }

  printer->Print("}\n");
}